

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

Token * __thiscall wabt::Token::operator=(Token *this,Token *other)

{
  bool bVar1;
  Token *other_local;
  Token *this_local;
  
  Destroy(this);
  (this->loc).filename.data_ = (other->loc).filename.data_;
  (this->loc).filename.size_ = (other->loc).filename.size_;
  (this->loc).field_1.field_1.offset = (other->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&(other->loc).field_1 + 8)
  ;
  this->token_type_ = other->token_type_;
  bVar1 = HasLiteral(this);
  if (bVar1) {
    Construct<wabt::Literal,wabt::Literal_const&>
              (&(this->field_2).literal_,&(other->field_2).literal_);
  }
  else {
    bVar1 = HasOpcode(this);
    if (bVar1) {
      Construct<wabt::Opcode,wabt::Opcode_const&>
                (&(this->field_2).opcode_,&(other->field_2).opcode_);
    }
    else {
      bVar1 = HasText(this);
      if (bVar1) {
        Construct<std::__cxx11::string,std::__cxx11::string_const&>
                  (&(this->field_2).text_,&(other->field_2).text_);
      }
      else {
        bVar1 = HasType(this);
        if (bVar1) {
          Construct<wabt::Type,wabt::Type_const&>(&(this->field_2).type_,&(other->field_2).type_);
        }
      }
    }
  }
  return this;
}

Assistant:

Token& Token::operator=(const Token& other) {
  Destroy();
  loc = other.loc;
  token_type_ = other.token_type_;

  if (HasLiteral()) {
    Construct(literal_, other.literal_);
  } else if (HasOpcode()) {
    Construct(opcode_, other.opcode_);
  } else if (HasText()) {
    Construct(text_, other.text_);
  } else if (HasType()) {
    Construct(type_, other.type_);
  }

  return *this;
}